

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  size_type sVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  int i;
  LogMessage *in_stack_ffffffffffffff18;
  LogMessage *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  LogLevel level;
  LogMessage *in_stack_ffffffffffffff30;
  int local_b0;
  undefined1 local_a8 [79];
  byte local_59;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_20 = in_RCX;
  bVar1 = SourceCodeInfo_Location::has_leading_comments((SourceCodeInfo_Location *)0x60725d);
  local_59 = 0;
  if (bVar1) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff30,level,(char *)in_stack_ffffffffffffff20,
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    local_59 = 1;
    internal::LogMessage::operator<<(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x6072da);
  }
  bVar1 = SourceCodeInfo_Location::has_trailing_comments((SourceCodeInfo_Location *)0x6072e8);
  if (bVar1) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff30,(LogLevel)((ulong)local_a8 >> 0x20),
               (char *)in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    internal::LogMessage::operator<<(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    internal::LogMessage::~LogMessage((LogMessage *)0x607356);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar3 = SourceCodeInfo_Location::mutable_leading_comments_abi_cxx11_
                       ((SourceCodeInfo_Location *)0x607375);
    std::__cxx11::string::swap((string *)psVar3);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar3 = SourceCodeInfo_Location::mutable_trailing_comments_abi_cxx11_
                       ((SourceCodeInfo_Location *)0x6073fe);
    std::__cxx11::string::swap((string *)psVar3);
  }
  local_b0 = 0;
  while( true ) {
    uVar2 = (ulong)local_b0;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_20);
    if (sVar4 <= uVar2) break;
    psVar3 = SourceCodeInfo_Location::add_leading_detached_comments_abi_cxx11_
                       ((SourceCodeInfo_Location *)0x607448);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_20,(long)local_b0);
    std::__cxx11::string::swap((string *)psVar3);
    local_b0 = local_b0 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x607484);
  return;
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    std::string* leading, std::string* trailing,
    std::vector<std::string>* detached_comments) const {
  GOOGLE_CHECK(!location_->has_leading_comments());
  GOOGLE_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
  for (int i = 0; i < detached_comments->size(); ++i) {
    location_->add_leading_detached_comments()->swap((*detached_comments)[i]);
  }
  detached_comments->clear();
}